

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::Split
               (string *str,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *lines,char separator)

{
  size_type sVar1;
  long lVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string data;
  
  std::__cxx11::string::string((string *)&data,(string *)str);
  uVar3 = 0;
  do {
    sVar1 = data._M_string_length;
    if (data._M_string_length <= uVar3) {
LAB_003f2e7d:
      std::__cxx11::string::~string((string *)&data);
      return sVar1 <= uVar3;
    }
    lVar2 = std::__cxx11::string::find((char)&data,(ulong)(uint)(int)separator);
    if (lVar2 == -1) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&data);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)lines,
                 &local_70);
      std::__cxx11::string::~string((string *)&local_70);
      goto LAB_003f2e7d;
    }
    std::__cxx11::string::substr((ulong)&local_70,(ulong)&data);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)lines,&local_70)
    ;
    std::__cxx11::string::~string((string *)&local_70);
    uVar3 = lVar2 + 1;
  } while( true );
}

Assistant:

bool SystemTools::Split(const kwsys_stl::string& str, kwsys_stl::vector<kwsys_stl::string>& lines, char separator)
{
  kwsys_stl::string data(str);
  kwsys_stl::string::size_type lpos = 0;
  while(lpos < data.length())
    {
    kwsys_stl::string::size_type rpos = data.find_first_of(separator, lpos);
    if(rpos == kwsys_stl::string::npos)
      {
      // Line ends at end of string without a newline.
      lines.push_back(data.substr(lpos));
      return false;
      }
    else
      {
      // Line ends in a "\n", remove the character.
      lines.push_back(data.substr(lpos, rpos-lpos));
      }
    lpos = rpos+1;
    }
  return true;
}